

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node_struct * pugi::impl::anon_unknown_0::allocate_node(xml_allocator *alloc,xml_node_type type)

{
  void *memory;
  xml_memory_page *page;
  xml_allocator *pxStack_18;
  xml_node_type type_local;
  xml_allocator *alloc_local;
  
  page._4_4_ = type;
  pxStack_18 = alloc;
  alloc_local = (xml_allocator *)
                xml_allocator::allocate_object(alloc,0x40,(xml_memory_page **)&memory);
  if ((xml_node_struct *)alloc_local == (xml_node_struct *)0x0) {
    alloc_local = (xml_allocator *)0x0;
  }
  else {
    xml_node_struct::xml_node_struct
              ((xml_node_struct *)alloc_local,(xml_memory_page *)memory,page._4_4_);
  }
  return (xml_node_struct *)alloc_local;
}

Assistant:

inline xml_node_struct* allocate_node(xml_allocator& alloc, xml_node_type type)
	{
		xml_memory_page* page;
		void* memory = alloc.allocate_object(sizeof(xml_node_struct), page);
		if (!memory) return 0;

		return new (memory) xml_node_struct(page, type);
	}